

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O1

void Abc_TruthDecPerform(Abc_TtStore_t *p,int DecType,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *vStr;
  Vec_Int_t *vCover;
  int *piVar3;
  Dec_Graph_t *pGraph;
  Bdc_Man_t *p_00;
  word *pwVar4;
  Kit_DsdNtk_t *pNtk;
  byte bVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  char *pcVar14;
  int iVar15;
  timespec *__s;
  word *pwVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  word *pwVar20;
  bool bVar21;
  word *tLimit;
  timespec ts;
  undefined4 in_stack_fffffffffffff7d8;
  timespec local_808 [125];
  
  iVar1 = clock_gettime(3,local_808);
  if (iVar1 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_808[0].tv_nsec._4_4_,(undefined4)local_808[0].tv_nsec)),8)
    ;
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_808[0].tv_sec * -1000000;
  }
  if (DecType == 1) {
    pcVar14 = "factoring";
    goto LAB_002b0511;
  }
  switch(DecType) {
  case 2:
    pcVar14 = "bi-decomp";
    break;
  case 3:
    pcVar14 = "DSD";
    break;
  case 4:
    pcVar14 = "fast DSD";
    break;
  case 5:
    pcVar14 = "analysis";
    break;
  case 6:
    pcVar14 = "DSD ICCD\'15";
    break;
  default:
    bVar21 = true;
    pcVar14 = (char *)0x0;
    goto LAB_002b0513;
  }
LAB_002b0511:
  bVar21 = false;
LAB_002b0513:
  if (!bVar21) {
    pcVar6 = "s";
    if (p->nFuncs == 1) {
      pcVar6 = "";
    }
    printf("Applying %-10s to %8d func%s of %2d vars...  ",pcVar14,(ulong)(uint)p->nFuncs,pcVar6);
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  if (DecType == 1) {
    iVar1 = fVerbose;
    vStr = (Vec_Str_t *)malloc(0x10);
    vStr->nCap = 10000;
    vStr->nSize = 0;
    pcVar14 = (char *)malloc(10000);
    vStr->pArray = pcVar14;
    vCover = (Vec_Int_t *)malloc(0x10);
    vCover->nCap = 0x10000;
    vCover->nSize = 0;
    piVar3 = (int *)malloc(0x40000);
    vCover->pArray = piVar3;
    if (p->nFuncs < 1) {
      uVar19 = 0;
    }
    else {
      uVar10 = 0;
      uVar19 = 0;
      do {
        bVar21 = fVerbose != 0;
        fVerbose = iVar1;
        if (bVar21) {
          printf("%7d : ",uVar10 & 0xffffffff);
          fVerbose = iVar1;
        }
        pcVar14 = Kit_PlaFromTruthNew((uint *)p->pFuncs[uVar10],p->nVars,vCover,vStr);
        pGraph = Dec_Factor(pcVar14);
        uVar19 = (uVar19 + pGraph->nSize) - pGraph->nLeaves;
        if (fVerbose != 0) {
          Dec_GraphPrint(_stdout,pGraph,(char **)0x0,(char *)0x0);
        }
        if (pGraph->pNodes != (Dec_Node_t *)0x0) {
          free(pGraph->pNodes);
          pGraph->pNodes = (Dec_Node_t *)0x0;
        }
        if (pGraph != (Dec_Graph_t *)0x0) {
          free(pGraph);
        }
        uVar10 = uVar10 + 1;
        iVar1 = fVerbose;
      } while ((long)uVar10 < (long)p->nFuncs);
    }
    if (vCover->pArray != (int *)0x0) {
      free(vCover->pArray);
      vCover->pArray = (int *)0x0;
    }
    free(vCover);
    if (vStr->pArray != (char *)0x0) {
      free(vStr->pArray);
      vStr->pArray = (char *)0x0;
    }
    free(vStr);
    goto LAB_002b0b10;
  }
  switch(DecType) {
  case 2:
    local_808[0].tv_nsec._0_4_ = 0;
    local_808[0].tv_sec = (__time_t)(uint)p->nVars;
    iVar1 = fVerbose;
    p_00 = Bdc_ManAlloc((Bdc_Par_t *)local_808);
    if (p->nFuncs < 1) {
      uVar19 = 0;
    }
    else {
      uVar10 = 0;
      uVar19 = 0;
      do {
        bVar21 = fVerbose != 0;
        fVerbose = iVar1;
        if (bVar21) {
          printf("%7d :      ",uVar10 & 0xffffffff);
          fVerbose = iVar1;
        }
        Bdc_ManDecompose(p_00,(uint *)p->pFuncs[uVar10],(uint *)0x0,p->nVars,(Vec_Ptr_t *)0x0,1000);
        iVar1 = Bdc_ManAndNum(p_00);
        if (fVerbose != 0) {
          Bdc_ManDecPrint(p_00);
        }
        uVar19 = uVar19 + iVar1;
        uVar10 = uVar10 + 1;
        iVar1 = fVerbose;
      } while ((long)uVar10 < (long)p->nFuncs);
    }
    Bdc_ManFree(p_00);
    goto LAB_002b0b10;
  case 3:
    if (0 < p->nFuncs) {
      uVar10 = 0;
      uVar19 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d :      ",uVar10 & 0xffffffff);
        }
        pNtk = Kit_DsdDecomposeMux((uint *)p->pFuncs[uVar10],p->nVars,3);
        if (fVerbose != 0) {
          Kit_DsdPrintExpanded(pNtk);
          putchar(10);
        }
        iVar1 = Kit_DsdCountAigNodes(pNtk);
        uVar19 = uVar19 + iVar1;
        Kit_DsdNtkFree(pNtk);
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)p->nFuncs);
      goto LAB_002b0b10;
    }
    break;
  case 4:
    if (0 < p->nFuncs) {
      uVar10 = 0;
      uVar19 = 0;
      iVar1 = fVerbose;
      do {
        if (fVerbose == 0) {
          Dau_DsdDecompose(p->pFuncs[uVar10],p->nVars,0,1,(char *)local_808);
        }
        else {
          printf("%7d :      ",uVar10 & 0xffffffff);
          Dau_DsdDecompose(p->pFuncs[uVar10],p->nVars,0,1,(char *)local_808);
          puts((char *)local_808);
        }
        iVar18 = Dau_DsdCountAnds((char *)CONCAT44(iVar1,in_stack_fffffffffffff7d8));
        uVar19 = uVar19 + iVar18;
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)p->nFuncs);
      goto LAB_002b0b10;
    }
    break;
  case 5:
    if (0 < p->nFuncs) {
      uVar10 = 0;
      do {
        pwVar4 = p->pFuncs[uVar10];
        iVar1 = p->nVars;
        iVar18 = 0;
        if (0 < (long)iVar1) {
          iVar2 = iVar1 + -6;
          uVar7 = 1 << ((byte)iVar2 & 0x1f);
          uVar19 = uVar7;
          if ((int)uVar7 < 2) {
            uVar19 = 1;
          }
          uVar9 = 0;
          iVar18 = 0;
LAB_002b08f6:
          if (iVar1 < 7) {
            uVar13 = (uint)((s_Truths6Neg[uVar9] &
                            (*pwVar4 >> ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f) ^ *pwVar4)) != 0)
            ;
          }
          else {
            uVar13 = 0;
            if (uVar9 < 6) {
              if (iVar2 != 0x1f) {
                uVar11 = 0;
                do {
                  if (((pwVar4[uVar11] >> ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f) ^
                       pwVar4[uVar11]) & s_Truths6Neg[uVar9]) != 0) goto LAB_002b09ca;
                  uVar11 = uVar11 + 1;
                  uVar13 = 0;
                } while (uVar19 != uVar11);
              }
            }
            else if (iVar2 != 0x1f) {
              bVar5 = (byte)(uVar9 - 6);
              uVar13 = 1 << (bVar5 & 0x1f);
              iVar15 = 2 << (bVar5 & 0x1f);
              uVar11 = 1;
              if (1 < (int)uVar13) {
                uVar11 = (ulong)uVar13;
              }
              pwVar20 = pwVar4 + (int)uVar13;
              pwVar16 = pwVar4;
              do {
                if (uVar9 - 6 != 0x1f) {
                  uVar17 = 0;
                  do {
                    if (pwVar16[uVar17] != pwVar20[uVar17]) goto LAB_002b09ca;
                    uVar17 = uVar17 + 1;
                  } while (uVar11 != uVar17);
                }
                pwVar16 = pwVar16 + iVar15;
                pwVar20 = pwVar20 + iVar15;
                uVar13 = 0;
              } while (pwVar16 < pwVar4 + (int)uVar7);
            }
          }
          goto LAB_002b09d7;
        }
LAB_002b09e6:
        if (fVerbose == 0) {
          Dau_DecTrySets(pwVar4,iVar18,0);
        }
        else {
          iVar1 = fVerbose;
          printf("%7d :      ",uVar10 & 0xffffffff);
          Dau_DecTrySets(p->pFuncs[uVar10],iVar18,fVerbose);
          putchar(10);
          fVerbose = iVar1;
        }
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)p->nFuncs);
    }
    break;
  case 6:
    pwVar4 = Dsc_alloc_pool(p->nVars);
    if (p->nFuncs < 1) {
      uVar19 = 0;
    }
    else {
      uVar10 = 0;
      uVar19 = 0;
      do {
        if (fVerbose == 0) {
          Dsc_Decompose(p->pFuncs[uVar10],p->nVars,(char *)local_808,pwVar4);
        }
        else {
          printf("%7d :      ",uVar10 & 0xffffffff);
          Dsc_Decompose(p->pFuncs[uVar10],p->nVars,(char *)local_808,pwVar4);
          __s = local_808;
          if ((char)local_808[0].tv_sec == '\0') {
            __s = (timespec *)0x9e8b18;
          }
          puts((char *)__s);
        }
        iVar1 = Dsc_CountAnds((char *)CONCAT44(fVerbose,in_stack_fffffffffffff7d8));
        uVar19 = uVar19 + iVar1;
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)p->nFuncs);
    }
    Dsc_free_pool(pwVar4);
    goto LAB_002b0b10;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDec.c"
                  ,0x2a7,"void Abc_TruthDecPerform(Abc_TtStore_t *, int, int)");
  }
  uVar19 = 0;
LAB_002b0b10:
  printf("AIG nodes =%9d  ",(ulong)uVar19);
  iVar1 = clock_gettime(3,local_808);
  if (iVar1 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = CONCAT44(local_808[0].tv_nsec._4_4_,(undefined4)local_808[0].tv_nsec) / 1000 +
             local_808[0].tv_sec * 1000000;
  }
  Abc_Print(1,"%s =","Time");
  Abc_Print(1,"%9.2f sec\n",(double)(lVar12 + lVar8) / 1000000.0);
  return;
LAB_002b09ca:
  uVar13 = 1;
LAB_002b09d7:
  iVar18 = iVar18 + uVar13;
  uVar9 = uVar9 + 1;
  if (uVar9 == (long)iVar1) goto LAB_002b09e6;
  goto LAB_002b08f6;
}

Assistant:

void Abc_TruthDecPerform( Abc_TtStore_t * p, int DecType, int fVerbose )
{
    abctime clk = Abc_Clock();
    int i, nNodes = 0;

    char * pAlgoName = NULL;
    if ( DecType == 1 )
        pAlgoName = "factoring";
    else if ( DecType == 2 )
        pAlgoName = "bi-decomp";
    else if ( DecType == 3 )
        pAlgoName = "DSD";
    else if ( DecType == 4 )
        pAlgoName = "fast DSD";
    else if ( DecType == 5 )
        pAlgoName = "analysis";
    else if ( DecType == 6 )
            pAlgoName = "DSD ICCD'15";

    if ( pAlgoName )
        printf( "Applying %-10s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( DecType == 1 )
    {
        // perform algebraic factoring and count AIG nodes
        Dec_Graph_t * pFForm;
        Vec_Int_t * vCover;
        Vec_Str_t * vStr;
        char * pSopStr;
        vStr = Vec_StrAlloc( 10000 );
        vCover = Vec_IntAlloc( 1 << 16 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
//            extern int Abc_IsopTest( word * pFunc, int nVars, Vec_Int_t * vCover );
//            if ( i == 0 ) printf( "\n" );
//            Abc_IsopTest( p->pFuncs[i], p->nVars, vCover );
//            continue;
            if ( fVerbose )
                printf( "%7d : ", i );
            pSopStr = Kit_PlaFromTruthNew( (unsigned *)p->pFuncs[i], p->nVars, vCover, vStr );
            pFForm = Dec_Factor( pSopStr );
            nNodes += Dec_GraphNodeNum( pFForm );
            if ( fVerbose )
                Dec_GraphPrint( stdout, pFForm, NULL, NULL );
            Dec_GraphFree( pFForm );
        }
        Vec_IntFree( vCover );
        Vec_StrFree( vStr );
    }
    else if ( DecType == 2 )
    {
        // perform bi-decomposition and count AIG nodes
        Bdc_Man_t * pManDec;
        Bdc_Par_t Pars = {0}, * pPars = &Pars;
        pPars->nVarsMax = p->nVars;
        pManDec = Bdc_ManAlloc( pPars );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Bdc_ManDecompose( pManDec, (unsigned *)p->pFuncs[i], NULL, p->nVars, NULL, 1000 );
            nNodes += Bdc_ManAndNum( pManDec );
            if ( fVerbose )
                Bdc_ManDecPrint( pManDec );
        }
        Bdc_ManFree( pManDec );
    }
    else if ( DecType == 3 )
    {
        // perform disjoint-support decomposition and count AIG nodes
        // (non-DSD blocks are decomposed into 2:1 MUXes, each counting as 3 AIG nodes)
        Kit_DsdNtk_t * pNtk;
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            pNtk = Kit_DsdDecomposeMux( (unsigned *)p->pFuncs[i], p->nVars, 3 );
            if ( fVerbose )
                Kit_DsdPrintExpanded( pNtk ), printf( "\n" );
            nNodes += Kit_DsdCountAigNodes( pNtk );
            Kit_DsdNtkFree( pNtk );
        }
    }
    else if ( DecType == 4 )
    {
        char pDsd[DAU_MAX_STR];
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DsdDecompose( p->pFuncs[i], p->nVars, 0, 1, pDsd );
            if ( fVerbose )
                printf( "%s\n", pDsd );
            nNodes += Dau_DsdCountAnds( pDsd );
        }
    }
    else if ( DecType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            extern void Dau_DecTrySets( word * pInit, int nVars, int fVerbose );
            int nSuppSize = Abc_TtSupportSize( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DecTrySets( p->pFuncs[i], nSuppSize, fVerbose );
            if ( fVerbose )
                printf( "\n" );
        }
    } else if ( DecType == 6 )
    {
        char pDsd[DSC_MAX_STR];
        /* memory pool with a capacity of storing 3*nVars
        truth-tables for negative and positive cofactors and
        the boolean difference for each input variable */
        word *mem_pool = Dsc_alloc_pool(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dsc_Decompose(p->pFuncs[i], p->nVars, pDsd, mem_pool);
            if ( fVerbose )
                printf( "%s\n", pDsd[0] ? pDsd : "NULL");
            nNodes += Dsc_CountAnds( pDsd );
        }
        Dsc_free_pool(mem_pool);
    }
    else assert( 0 );

    printf( "AIG nodes =%9d  ", nNodes );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}